

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<false,_false,_false>::edge_
          (DaTrie<false,_false,_false> *this,uint32_t node_pos,Edge *edge,size_t upper)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  const_reference pvVar4;
  size_t sVar5;
  size_t in_RCX;
  Edge *in_RDX;
  uint in_ESI;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  uint32_t child_pos;
  uint32_t label;
  uint32_t base;
  uint local_28;
  
  pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)in_ESI);
  bVar1 = Bc::is_fixed(pvVar4);
  if (!bVar1) {
    __assert_fail("bc_[node_pos].is_fixed()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x3d5,
                  "void ddd::DaTrie<false, false, false>::edge_(uint32_t, Edge &, size_t) const [WithBLM = false, WithNLM = false, Prefix = false]"
                 );
  }
  Edge::clear(in_RDX);
  pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)in_ESI);
  bVar1 = Bc::is_leaf(pvVar4);
  if (!bVar1) {
    pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)in_ESI);
    uVar2 = Bc::base(pvVar4);
    if (uVar2 != 0x7fffffff) {
      for (local_28 = 0; local_28 < 0x100; local_28 = local_28 + 1) {
        pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                           (in_RDI,(ulong)(uVar2 ^ local_28));
        uVar3 = Bc::check(pvVar4);
        if (uVar3 == in_ESI) {
          Edge::push(in_RDX,(uint8_t)local_28);
          sVar5 = Edge::size(in_RDX);
          if (sVar5 == in_RCX) {
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void edge_(uint32_t node_pos, Edge& edge, size_t upper = 256) const {
    assert(bc_[node_pos].is_fixed());

    edge.clear();
    if (bc_[node_pos].is_leaf()) {
      return;
    }

    auto base = bc_[node_pos].base();
    if (base == INVALID_VALUE) { // for prefix subtrie
      return;
    }

    if (WithNLM) {
      edge.push(node_links_[node_pos].child);
      auto child_pos = base ^node_links_[node_pos].child;
      assert(bc_[child_pos].check() == node_pos);
      while (edge.size() < upper && node_links_[child_pos].sib != node_links_[node_pos].child) {
        edge.push(node_links_[child_pos].sib);
        child_pos = base ^ node_links_[child_pos].sib;
        assert(bc_[child_pos].check() == node_pos);
      }
    } else {
      for (uint32_t label = 0; label < 256; ++label) {
        auto child_pos = base ^label;
        if (bc_[child_pos].check() == node_pos) {
          edge.push(static_cast<uint8_t>(label));
          if (edge.size() == upper) {
            break;
          }
        }
      }
    }
  }